

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

CppTypeName * __thiscall
capnp::anon_unknown_1::CppTypeName::makeTemplateParam
          (CppTypeName *__return_storage_ptr__,CppTypeName *this,StringPtr name)

{
  StringPtr name_local;
  StringTree local_48;
  
  name_local.content.size_ = (size_t)name.content.ptr;
  name_local.content.ptr = (char *)this;
  kj::strTree<kj::StringPtr&>(&local_48,(kj *)&name_local,(StringPtr *)name_local.content.size_);
  CppTypeName(__return_storage_ptr__,&local_48,true);
  kj::StringTree::~StringTree(&local_48);
  return __return_storage_ptr__;
}

Assistant:

static CppTypeName makeTemplateParam(kj::StringPtr name) {
    return CppTypeName(kj::strTree(name), true);
  }